

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall icu_63::CollationDataBuilder::~CollationDataBuilder(CollationDataBuilder *this)

{
  CollationDataBuilder *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationDataBuilder_005b54a0;
  utrie2_close_63(this->trie);
  if (this->fastLatinBuilder != (CollationFastLatinBuilder *)0x0) {
    (*(this->fastLatinBuilder->super_UObject)._vptr_UObject[1])();
  }
  if (this->collIter != (DataBuilderCollationIterator *)0x0) {
    (*(this->collIter->super_CollationIterator).super_UObject._vptr_UObject[1])();
  }
  UnicodeSet::~UnicodeSet(&this->unsafeBackwardSet);
  icu_63::UnicodeString::~UnicodeString(&this->contexts);
  UnicodeSet::~UnicodeSet(&this->contextChars);
  UVector::~UVector(&this->conditionalCE32s);
  UVector64::~UVector64(&this->ce64s);
  UVector32::~UVector32(&this->ce32s);
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

CollationDataBuilder::~CollationDataBuilder() {
    utrie2_close(trie);
    delete fastLatinBuilder;
    delete collIter;
}